

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::BloomFilterHeader::printTo(BloomFilterHeader *this,ostream *out)

{
  ostream *poVar1;
  string local_40;
  
  std::operator<<(out,"BloomFilterHeader(");
  poVar1 = std::operator<<(out,"numBytes=");
  duckdb_apache::thrift::to_string<int>(&local_40,&this->numBytes);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"algorithm=");
  duckdb_apache::thrift::to_string<duckdb_parquet::BloomFilterAlgorithm>(&local_40,&this->algorithm)
  ;
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"hash=");
  duckdb_apache::thrift::to_string<duckdb_parquet::BloomFilterHash>(&local_40,&this->hash);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,", ");
  poVar1 = std::operator<<(poVar1,"compression=");
  duckdb_apache::thrift::to_string<duckdb_parquet::BloomFilterCompression>
            (&local_40,&this->compression);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::operator<<(out,")");
  return;
}

Assistant:

void BloomFilterHeader::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "BloomFilterHeader(";
  out << "numBytes=" << to_string(numBytes);
  out << ", " << "algorithm=" << to_string(algorithm);
  out << ", " << "hash=" << to_string(hash);
  out << ", " << "compression=" << to_string(compression);
  out << ")";
}